

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

cmStateSnapshot * __thiscall
cmState::CreateBuildsystemDirectorySnapshot
          (cmStateSnapshot *__return_storage_ptr__,cmState *this,cmStateSnapshot *originSnapshot)

{
  cmLinkedTree<cmDefinitions> *pcVar1;
  PositionType PVar2;
  PositionType PVar3;
  PositionType PVar4;
  bool bVar5;
  PointerType pSVar6;
  PointerType pBVar7;
  PointerType pSVar8;
  iterator iVar9;
  iterator iVar10;
  iterator iVar11;
  cmLinkedTree<cmDefinitions> *local_98;
  PositionType local_90;
  iterator origin;
  cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_68;
  PositionType local_60;
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *local_48;
  PositionType local_40;
  undefined1 local_28 [8];
  PositionType pos;
  cmStateSnapshot *originSnapshot_local;
  cmState *this_local;
  
  pos.Position = (PositionType)originSnapshot;
  bVar5 = cmStateSnapshot::IsValid(originSnapshot);
  if (!bVar5) {
    __assert_fail("originSnapshot.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmState.cxx"
                  ,0x2e4,
                  "cmStateSnapshot cmState::CreateBuildsystemDirectorySnapshot(const cmStateSnapshot &)"
                 );
  }
  _local_28 = cmLinkedTree<cmStateDetail::SnapshotDataType>::Push
                        (&this->SnapshotData,*(iterator *)(pos.Position + 8));
  PVar3 = pos.Position;
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_28)
  ;
  PVar4 = pos.Position;
  (pSVar6->DirectoryParent).Tree = *(cmLinkedTree<cmStateDetail::SnapshotDataType> **)(PVar3 + 8);
  (pSVar6->DirectoryParent).Position = *(PositionType *)(PVar3 + 0x10);
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_28)
  ;
  (pSVar6->ScopeParent).Tree = *(cmLinkedTree<cmStateDetail::SnapshotDataType> **)(PVar4 + 8);
  (pSVar6->ScopeParent).Position = *(PositionType *)(PVar4 + 0x10);
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_28)
  ;
  pSVar6->SnapshotType = BuildsystemDirectoryType;
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_28)
  ;
  pSVar6->Keep = true;
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     ((iterator *)(pos.Position + 8));
  iVar9 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::Push
                    (&this->BuildsystemDirectory,pSVar6->BuildSystemDirectory);
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_28)
  ;
  local_48 = iVar9.Tree;
  (pSVar6->BuildSystemDirectory).Tree = local_48;
  local_40 = iVar9.Position;
  (pSVar6->BuildSystemDirectory).Position = local_40;
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     ((iterator *)(pos.Position + 8));
  iVar10 = cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::Push(&this->ExecutionListFiles,pSVar6->ExecutionListFile);
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_28)
  ;
  local_68 = iVar10.Tree;
  (pSVar6->ExecutionListFile).Tree = local_68;
  local_60 = iVar10.Position;
  (pSVar6->ExecutionListFile).Position = local_60;
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_28)
  ;
  pBVar7 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar6->BuildSystemDirectory);
  (pBVar7->DirectoryEnd).Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_28;
  (pBVar7->DirectoryEnd).Position = (PositionType)pos.Tree;
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     ((iterator *)(pos.Position + 8));
  pSVar8 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_28)
  ;
  (pSVar8->Policies).Tree = (pSVar6->Policies).Tree;
  (pSVar8->Policies).Position = (pSVar6->Policies).Position;
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     ((iterator *)(pos.Position + 8));
  pSVar8 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_28)
  ;
  (pSVar8->PolicyRoot).Tree = (pSVar6->Policies).Tree;
  (pSVar8->PolicyRoot).Position = (pSVar6->Policies).Position;
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     ((iterator *)(pos.Position + 8));
  pSVar8 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_28)
  ;
  (pSVar8->PolicyScope).Tree = (pSVar6->Policies).Tree;
  (pSVar8->PolicyScope).Position = (pSVar6->Policies).Position;
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_28)
  ;
  bVar5 = cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator::IsValid(&pSVar6->Policies);
  if (!bVar5) {
    __assert_fail("pos->Policies.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmState.cxx"
                  ,0x2f3,
                  "cmStateSnapshot cmState::CreateBuildsystemDirectorySnapshot(const cmStateSnapshot &)"
                 );
  }
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_28)
  ;
  bVar5 = cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator::IsValid(&pSVar6->PolicyRoot);
  if (!bVar5) {
    __assert_fail("pos->PolicyRoot.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmState.cxx"
                  ,0x2f4,
                  "cmStateSnapshot cmState::CreateBuildsystemDirectorySnapshot(const cmStateSnapshot &)"
                 );
  }
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     ((iterator *)(pos.Position + 8));
  pcVar1 = (pSVar6->Vars).Tree;
  PVar2 = (pSVar6->Vars).Position;
  iVar11 = pSVar6->Vars;
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_28)
  ;
  (pSVar6->Parent).Tree = pcVar1;
  (pSVar6->Parent).Position = PVar2;
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_28)
  ;
  (pSVar6->Root).Tree = pcVar1;
  (pSVar6->Root).Position = PVar2;
  iVar11 = cmLinkedTree<cmDefinitions>::Push(&this->VarTree,iVar11);
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_28)
  ;
  local_98 = iVar11.Tree;
  (pSVar6->Vars).Tree = local_98;
  local_90 = iVar11.Position;
  (pSVar6->Vars).Position = local_90;
  cmStateSnapshot::cmStateSnapshot(__return_storage_ptr__,this,_local_28);
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     ((iterator *)(pos.Position + 8));
  pBVar7 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar6->BuildSystemDirectory);
  std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::push_back
            (&pBVar7->Children,__return_storage_ptr__);
  cmStateSnapshot::SetDefaultDefinitions(__return_storage_ptr__);
  cmStateSnapshot::InitializeFromParent(__return_storage_ptr__);
  cmStateSnapshot::SetDirectoryDefinitions(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

cmStateSnapshot cmState::CreateBuildsystemDirectorySnapshot(
  cmStateSnapshot const& originSnapshot)
{
  assert(originSnapshot.IsValid());
  cmStateDetail::PositionType pos =
    this->SnapshotData.Push(originSnapshot.Position);
  pos->DirectoryParent = originSnapshot.Position;
  pos->ScopeParent = originSnapshot.Position;
  pos->SnapshotType = cmStateEnums::BuildsystemDirectoryType;
  pos->Keep = true;
  pos->BuildSystemDirectory = this->BuildsystemDirectory.Push(
    originSnapshot.Position->BuildSystemDirectory);
  pos->ExecutionListFile =
    this->ExecutionListFiles.Push(originSnapshot.Position->ExecutionListFile);
  pos->BuildSystemDirectory->DirectoryEnd = pos;
  pos->Policies = originSnapshot.Position->Policies;
  pos->PolicyRoot = originSnapshot.Position->Policies;
  pos->PolicyScope = originSnapshot.Position->Policies;
  assert(pos->Policies.IsValid());
  assert(pos->PolicyRoot.IsValid());

  cmLinkedTree<cmDefinitions>::iterator origin = originSnapshot.Position->Vars;
  pos->Parent = origin;
  pos->Root = origin;
  pos->Vars = this->VarTree.Push(origin);

  cmStateSnapshot snapshot = cmStateSnapshot(this, pos);
  originSnapshot.Position->BuildSystemDirectory->Children.push_back(snapshot);
  snapshot.SetDefaultDefinitions();
  snapshot.InitializeFromParent();
  snapshot.SetDirectoryDefinitions();
  return snapshot;
}